

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditField.cpp
# Opt level: O1

double __thiscall CreditField::AddCredit(CreditField *this,double *credit)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  ulong uVar5;
  double addCreditConvert;
  string addCredit;
  istringstream istr;
  istringstream istr_1;
  double local_358;
  undefined1 *local_350;
  ulong local_348;
  undefined1 local_340;
  undefined7 uStack_33f;
  timespec local_330 [7];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_350 = &local_340;
  local_348 = 0;
  local_340 = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Insert Credit: ",0xf);
  std::operator>>((istream *)&std::cin,(string *)&local_350);
  if (local_348 != 0) {
    uVar5 = 0;
    do {
      if (9 < (int)(char)local_350[uVar5] - 0x30U && (char)local_350[uVar5] != 0x2e) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"counterfeit!",0xc)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        local_330[0].tv_sec = 3;
        local_330[0].tv_nsec = 0;
        do {
          iVar2 = nanosleep(local_330,local_330);
          if (iVar2 != -1) break;
          piVar3 = __errno_location();
        } while (*piVar3 == 4);
        *local_350 = 0;
        AddCredit(this,credit);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_348);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)local_330,(string *)&local_350,_S_in);
  std::istream::_M_extract<double>((double *)local_330);
  if (10000.0 < local_358) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The Limit is: ",0xe)
      ;
      poVar4 = std::ostream::_M_insert<double>(10000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," Euro!",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Invalid Input!",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Insert Credit To Play:",0x16);
      std::operator>>((istream *)&std::cin,(string *)&local_350);
      std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_350,_S_in);
      std::istream::_M_extract<double>((double *)local_1b0);
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
    } while (10000.0 < local_358);
  }
  *credit = local_358 + *credit;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Current Credit: ",0x10);
  poVar4 = std::ostream::_M_insert<double>(*credit);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"---------------------------",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  dVar1 = *credit;
  std::__cxx11::istringstream::~istringstream((istringstream *)local_330);
  std::ios_base::~ios_base(local_2b8);
  if (local_350 != &local_340) {
    operator_delete(local_350,CONCAT71(uStack_33f,local_340) + 1);
  }
  return dVar1;
}

Assistant:

double CreditField::AddCredit(double &credit) {
	std::string addCredit;
	std::cout << "Insert Credit: ";
	std::cin >> addCredit;
	for (int i = 0; i < addCredit.size(); i++) {
		if (!isdigit(addCredit[i]) && addCredit[i] != '.') {
			std::cout << "counterfeit!" << std::endl;
			std::chrono::seconds duration(3);
			std::this_thread::sleep_for(duration);
			addCredit[0] = 0;
			AddCredit(credit);
			
			//exit(0);
		}
	}
	double addCreditConvert;
	std::istringstream istr(addCredit);
	istr >> addCreditConvert;
	while (addCreditConvert > addCreditLimit) {
		std::cout << "The Limit is: " << addCreditLimit<< " Euro!" << std::endl;
		std::cout << "Invalid Input!" << std::endl;
		std::cout << "Insert Credit To Play:";
		std::cin >> addCredit;
		std::istringstream istr(addCredit);
		istr >> addCreditConvert;
	}
	credit += addCreditConvert;
	std::cout << "---------------------------" << std::endl;
	std::cout << "Current Credit: " << credit << std::endl;
	std::cout << "---------------------------" << std::endl;
	return credit;
}